

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi__uint32 sVar1;
  int iVar2;
  int channelCount;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  sVar1 = stbi__get32be(s);
  if (sVar1 == 0x38425053) {
    iVar2 = stbi__get16be(s);
    if (iVar2 == 1) {
      stbi__skip(s,6);
      iVar2 = stbi__get16be(s);
      if ((iVar2 < 0) || (0x10 < iVar2)) {
        stbi__rewind(s);
        s_local._4_4_ = 0;
      }
      else {
        sVar1 = stbi__get32be(s);
        *y = sVar1;
        sVar1 = stbi__get32be(s);
        *x = sVar1;
        iVar2 = stbi__get16be(s);
        if (iVar2 == 8) {
          iVar2 = stbi__get16be(s);
          if (iVar2 == 3) {
            *comp = 4;
            s_local._4_4_ = 1;
          }
          else {
            stbi__rewind(s);
            s_local._4_4_ = 0;
          }
        }
        else {
          stbi__rewind(s);
          s_local._4_4_ = 0;
        }
      }
    }
    else {
      stbi__rewind(s);
      s_local._4_4_ = 0;
    }
  }
  else {
    stbi__rewind(s);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__psd_info(stbi__context *s, int *x, int *y, int *comp)
{
   int channelCount;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   *y = stbi__get32be(s);
   *x = stbi__get32be(s);
   if (stbi__get16be(s) != 8) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 3) {
       stbi__rewind( s );
       return 0;
   }
   *comp = 4;
   return 1;
}